

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

bool checkInterfaceDirs(string *prepro,cmGeneratorTarget *target,string *prop)

{
  cmMakefile *this;
  size_t __n;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  PolicyStatus PVar7;
  string *c2;
  cmLocalGenerator *pcVar8;
  string *c2_00;
  string *c2_01;
  size_type sVar9;
  string *psVar10;
  ostream *poVar11;
  PolicyID id;
  PolicyID id_00;
  pointer input;
  char *pcVar12;
  MessageType t;
  bool bVar13;
  basic_string_view<char,_std::char_traits<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  ostringstream s;
  ostringstream e;
  string local_368;
  PolicyMap *local_348;
  string *local_340;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  this = target->Makefile;
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_INSTALL_PREFIX","");
  c2 = cmMakefile::GetSafeDefinition(this,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
  c2_00 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(pcVar8);
  pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
  c2_01 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar8);
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorExpression::Split(prepro,&local_338);
  __n = c2_00->_M_string_length;
  if (__n == c2_01->_M_string_length) {
    if (__n == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = bcmp((c2_00->_M_dataplus)._M_p,(c2_01->_M_dataplus)._M_p,__n);
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  local_340 = local_338.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_338.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_338.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar13 = true;
  }
  else {
    local_348 = &target->PolicyMap;
    bVar1 = 0;
    input = local_338.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar9 = cmGeneratorExpression::Find(input);
      if (sVar9 != 0) {
        local_1a8._8_8_ = (input->_M_dataplus)._M_p;
        local_1a8._0_8_ = input->_M_string_length;
        __str._M_str = "${_IMPORT_PREFIX}";
        __str._M_len = 0x11;
        iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0x11,
                           __str);
        if (iVar6 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          t = FATAL_ERROR;
          if (sVar9 != 0xffffffffffffffff) {
            iVar6 = std::__cxx11::string::compare((char *)prop);
            if ((iVar6 != 0) ||
               (PVar7 = cmPolicies::PolicyMap::Get(local_348,CMP0041), PVar7 - NEW < 3)) {
              bVar1 = 1;
              goto LAB_003e787b;
            }
            if (PVar7 != OLD) {
              if (PVar7 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_320,(cmPolicies *)0x29,id);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,(char *)local_320._0_8_,local_320._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                  operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
                }
                t = WARNING;
              }
              goto LAB_003e787b;
            }
            goto LAB_003e7ed9;
          }
LAB_003e787b:
          bVar2 = cmsys::SystemTools::FileIsFullPath(input);
          if (!bVar2) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
            psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(target);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(psVar10->_M_dataplus)._M_p,
                                 psVar10->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" ",2);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(prop->_M_dataplus)._M_p,prop->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11," property contains relative path:\n  \"",0x25);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(input->_M_dataplus)._M_p,input->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
            pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar8,t,(string *)local_320);
            if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
              operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
            }
          }
          bVar2 = cmsys::SystemTools::ComparePath(input,c2_01);
          bVar3 = true;
          if (!bVar2) {
            bVar3 = cmsys::SystemTools::IsSubDirectory(input,c2_01);
          }
          bVar2 = cmsys::SystemTools::ComparePath(input,c2_00);
          bVar4 = true;
          if (!bVar2) {
            bVar4 = cmsys::SystemTools::IsSubDirectory(input,c2_00);
          }
          bVar2 = cmsys::SystemTools::ComparePath(input,c2);
          if ((bVar2) || (bVar2 = cmsys::SystemTools::IsSubDirectory(input,c2), bVar2)) {
            if (bVar3 == false) {
              bVar5 = true;
              bVar2 = bVar4;
            }
            else {
              bVar2 = cmsys::SystemTools::ComparePath(c2,c2_01);
              bVar5 = true;
              if (!bVar2) {
                bVar5 = cmsys::SystemTools::IsSubDirectory(c2,c2_01);
              }
              bVar2 = (bool)(bVar4 & bVar5);
            }
            if (bVar2 != false) {
              bVar2 = cmsys::SystemTools::ComparePath(c2,c2_00);
              bVar5 = true;
              if (!bVar2) {
                bVar5 = cmsys::SystemTools::IsSubDirectory(c2,c2_00);
              }
            }
            iVar6 = std::__cxx11::string::compare((char *)prop);
            if ((bVar5 == false) && (iVar6 == 0)) {
              PVar7 = cmPolicies::PolicyMap::Get(local_348,CMP0052);
              if (PVar7 != OLD) {
                if (PVar7 != WARN) goto LAB_003e7c59;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_368,(cmPolicies *)0x34,id_00);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_320,local_368._M_dataplus._M_p,
                                     local_368._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_dataplus._M_p != &local_368.field_2) {
                  operator_delete(local_368._M_dataplus._M_p,
                                  local_368.field_2._M_allocated_capacity + 1);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,"Directory:\n    \"",0x10);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_320,(input->_M_dataplus)._M_p,
                                     input->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\"\nin INTERFACE_INCLUDE_DIRECTORIES of target \"",0x2e);
                psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" is a subdirectory of the install directory:\n    \"",0x33);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(c2->_M_dataplus)._M_p,c2->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\"\nhowever it is also a subdirectory of the ",0x2b);
                pcVar12 = "source";
                if (bVar3 != false) {
                  pcVar12 = "build";
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,6 - (ulong)bVar3)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," tree:\n    \"",0xc);
                psVar10 = c2_00;
                if (bVar3 != false) {
                  psVar10 = c2_01;
                }
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"\n",2);
                pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
                std::__cxx11::stringbuf::str();
                cmLocalGenerator::IssueMessage(pcVar8,AUTHOR_WARNING,&local_368);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_dataplus._M_p != &local_368.field_2) {
                  operator_delete(local_368._M_dataplus._M_p,
                                  local_368.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
                std::ios_base::~ios_base(local_2b0);
              }
            }
            else {
LAB_003e7c59:
              if (bVar5 == false) goto LAB_003e7c65;
            }
          }
          else {
LAB_003e7c65:
            if (bVar3 != false) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8)
              ;
              psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(target);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(psVar10->_M_dataplus)._M_p,
                                   psVar10->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" ",2);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(prop->_M_dataplus)._M_p,prop->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11," property contains path:\n  \"",0x1c);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(input->_M_dataplus)._M_p,input->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,"\"\nwhich is prefixed in the build directory.",0x2b);
              pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(pcVar8,t,(string *)local_320);
              if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
              }
            }
            if (bVar4 == true && !bVar13) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8)
              ;
              psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(target);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(psVar10->_M_dataplus)._M_p,
                                   psVar10->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" ",2);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(prop->_M_dataplus)._M_p,prop->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11," property contains path:\n  \"",0x1c);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(input->_M_dataplus)._M_p,input->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,"\"\nwhich is prefixed in the source directory.",0x2c);
              pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(pcVar8,t,(string *)local_320);
              if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
              }
            }
          }
LAB_003e7ed9:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      input = input + 1;
    } while (input != local_340);
    bVar13 = (bool)(bVar1 ^ 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  return bVar13;
}

Assistant:

static bool checkInterfaceDirs(const std::string& prepro,
                               cmGeneratorTarget const* target,
                               const std::string& prop)
{
  std::string const& installDir =
    target->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  std::string const& topSourceDir =
    target->GetLocalGenerator()->GetSourceDirectory();
  std::string const& topBinaryDir =
    target->GetLocalGenerator()->GetBinaryDirectory();

  std::vector<std::string> parts;
  cmGeneratorExpression::Split(prepro, parts);

  const bool inSourceBuild = topSourceDir == topBinaryDir;

  bool hadFatalError = false;

  for (std::string const& li : parts) {
    size_t genexPos = cmGeneratorExpression::Find(li);
    if (genexPos == 0) {
      continue;
    }
    if (cmHasLiteralPrefix(li, "${_IMPORT_PREFIX}")) {
      continue;
    }
    MessageType messageType = MessageType::FATAL_ERROR;
    std::ostringstream e;
    if (genexPos != std::string::npos) {
      if (prop == "INTERFACE_INCLUDE_DIRECTORIES") {
        switch (target->GetPolicyStatusCMP0041()) {
          case cmPolicies::WARN:
            messageType = MessageType::WARNING;
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0041) << "\n";
            break;
          case cmPolicies::OLD:
            continue;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            hadFatalError = true;
            break; // Issue fatal message.
        }
      } else {
        hadFatalError = true;
      }
    }
    if (!cmSystemTools::FileIsFullPath(li)) {
      /* clang-format off */
      e << "Target \"" << target->GetName() << "\" " << prop <<
           " property contains relative path:\n"
           "  \"" << li << "\"";
      /* clang-format on */
      target->GetLocalGenerator()->IssueMessage(messageType, e.str());
    }
    bool inBinary = isSubDirectory(li, topBinaryDir);
    bool inSource = isSubDirectory(li, topSourceDir);
    if (isSubDirectory(li, installDir)) {
      // The include directory is inside the install tree.  If the
      // install tree is not inside the source tree or build tree then
      // fall through to the checks below that the include directory is not
      // also inside the source tree or build tree.
      bool shouldContinue =
        (!inBinary || isSubDirectory(installDir, topBinaryDir)) &&
        (!inSource || isSubDirectory(installDir, topSourceDir));

      if (prop == "INTERFACE_INCLUDE_DIRECTORIES") {
        if (!shouldContinue) {
          switch (target->GetPolicyStatusCMP0052()) {
            case cmPolicies::WARN: {
              std::ostringstream s;
              s << cmPolicies::GetPolicyWarning(cmPolicies::CMP0052) << "\n";
              s << "Directory:\n    \"" << li
                << "\"\nin "
                   "INTERFACE_INCLUDE_DIRECTORIES of target \""
                << target->GetName()
                << "\" is a subdirectory of the install "
                   "directory:\n    \""
                << installDir
                << "\"\nhowever it is also "
                   "a subdirectory of the "
                << (inBinary ? "build" : "source") << " tree:\n    \""
                << (inBinary ? topBinaryDir : topSourceDir) << "\"\n";
              target->GetLocalGenerator()->IssueMessage(
                MessageType::AUTHOR_WARNING, s.str());
              CM_FALLTHROUGH;
            }
            case cmPolicies::OLD:
              shouldContinue = true;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
          }
        }
      }
      if (shouldContinue) {
        continue;
      }
    }
    if (inBinary) {
      /* clang-format off */
      e << "Target \"" << target->GetName() << "\" " << prop <<
           " property contains path:\n"
           "  \"" << li << "\"\nwhich is prefixed in the build directory.";
      /* clang-format on */
      target->GetLocalGenerator()->IssueMessage(messageType, e.str());
    }
    if (!inSourceBuild) {
      if (inSource) {
        e << "Target \"" << target->GetName() << "\" " << prop
          << " property contains path:\n"
             "  \""
          << li << "\"\nwhich is prefixed in the source directory.";
        target->GetLocalGenerator()->IssueMessage(messageType, e.str());
      }
    }
  }
  return !hadFatalError;
}